

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ihevc_itrans_recon.c
# Opt level: O0

void ihevc_itrans_recon_4x4_ttype1
               (WORD16 *pi2_src,WORD16 *pi2_tmp,UWORD8 *pu1_pred,UWORD8 *pu1_dst,WORD32 src_strd,
               WORD32 pred_strd,WORD32 dst_strd,WORD32 zero_cols,WORD32 zero_rows)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  char *in_RCX;
  byte *in_RDX;
  short *in_RSI;
  short *in_RDI;
  int in_R8D;
  int in_R9D;
  int in_stack_00000008;
  uint in_stack_00000010;
  WORD32 itrans_out;
  WORD32 trans_size;
  WORD16 *pi2_tmp_orig;
  WORD32 shift;
  WORD32 add;
  WORD32 c [4];
  WORD32 i;
  char local_c0;
  char local_bc;
  int local_b8;
  int local_b4;
  char local_b0;
  char local_ac;
  int local_a8;
  int local_a4;
  char local_a0;
  char local_9c;
  int local_98;
  int local_94;
  char local_90;
  char local_8c;
  int local_88;
  int local_84;
  short local_80;
  short local_7c;
  short local_78;
  short local_74;
  short local_70;
  short local_6c;
  short local_68;
  short local_64;
  int local_2c;
  char *local_20;
  byte *local_18;
  short *local_10;
  short *local_8;
  
  local_10 = in_RSI;
  local_8 = in_RDI;
  for (local_2c = 0; local_2c < 4; local_2c = local_2c + 1) {
    if ((in_stack_00000010 & 1) == 1) {
      memset(local_10,0,8);
    }
    else {
      iVar1 = (int)*local_8 + (int)local_8[in_R8D << 1];
      iVar2 = (int)local_8[in_R8D << 1] + (int)local_8[in_R8D * 3];
      iVar3 = (int)*local_8 - (int)local_8[in_R8D * 3];
      iVar4 = (int)local_8[in_R8D];
      iVar5 = iVar4 * 0x4a;
      if (iVar1 * 0x1d + iVar2 * 0x37 + iVar5 + 0x40 >> 7 < 0x8000) {
        if (iVar1 * 0x1d + iVar2 * 0x37 + iVar5 + 0x40 >> 7 < -0x8000) {
          local_68 = -0x8000;
        }
        else {
          local_68 = (short)(iVar1 * 0x1d + iVar2 * 0x37 + iVar5 + 0x40 >> 7);
        }
        local_64 = local_68;
      }
      else {
        local_64 = 0x7fff;
      }
      *local_10 = local_64;
      if (iVar3 * 0x37 + iVar2 * -0x1d + iVar5 + 0x40 >> 7 < 0x8000) {
        if (iVar3 * 0x37 + iVar2 * -0x1d + iVar5 + 0x40 >> 7 < -0x8000) {
          local_70 = -0x8000;
        }
        else {
          local_70 = (short)(iVar3 * 0x37 + iVar2 * -0x1d + iVar5 + 0x40 >> 7);
        }
        local_6c = local_70;
      }
      else {
        local_6c = 0x7fff;
      }
      local_10[1] = local_6c;
      if ((((int)*local_8 - (int)local_8[in_R8D << 1]) + (int)local_8[in_R8D * 3]) * 0x4a + 0x40 >>
          7 < 0x8000) {
        if ((((int)*local_8 - (int)local_8[in_R8D << 1]) + (int)local_8[in_R8D * 3]) * 0x4a + 0x40
            >> 7 < -0x8000) {
          local_78 = -0x8000;
        }
        else {
          local_78 = (short)((((int)*local_8 - (int)local_8[in_R8D << 1]) + (int)local_8[in_R8D * 3]
                             ) * 0x4a + 0x40 >> 7);
        }
        local_74 = local_78;
      }
      else {
        local_74 = 0x7fff;
      }
      local_10[2] = local_74;
      if (iVar1 * 0x37 + iVar3 * 0x1d + iVar4 * -0x4a + 0x40 >> 7 < 0x8000) {
        if (iVar1 * 0x37 + iVar3 * 0x1d + iVar4 * -0x4a + 0x40 >> 7 < -0x8000) {
          local_80 = -0x8000;
        }
        else {
          local_80 = (short)(iVar1 * 0x37 + iVar3 * 0x1d + iVar4 * -0x4a + 0x40 >> 7);
        }
        local_7c = local_80;
      }
      else {
        local_7c = 0x7fff;
      }
      local_10[3] = local_7c;
    }
    local_8 = local_8 + 1;
    local_10 = local_10 + 4;
    in_stack_00000010 = (int)in_stack_00000010 >> 1;
  }
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  for (local_2c = 0; local_2c < 4; local_2c = local_2c + 1) {
    iVar1 = (int)*local_10 + (int)local_10[8];
    iVar2 = (int)local_10[8] + (int)local_10[0xc];
    iVar3 = (int)*local_10 - (int)local_10[0xc];
    iVar4 = (int)local_10[4];
    iVar5 = iVar4 * 0x4a;
    if (iVar1 * 0x1d + iVar2 * 0x37 + iVar5 + 0x800 >> 0xc < 0x8000) {
      if (iVar1 * 0x1d + iVar2 * 0x37 + iVar5 + 0x800 >> 0xc < -0x8000) {
        local_88 = -0x8000;
      }
      else {
        local_88 = iVar1 * 0x1d + iVar2 * 0x37 + iVar5 + 0x800 >> 0xc;
      }
      local_84 = local_88;
    }
    else {
      local_84 = 0x7fff;
    }
    if ((int)(local_84 + (uint)*local_18) < 0x100) {
      if ((int)(local_84 + (uint)*local_18) < 0) {
        local_90 = '\0';
      }
      else {
        local_90 = (char)local_84 + *local_18;
      }
      local_8c = local_90;
    }
    else {
      local_8c = -1;
    }
    *local_20 = local_8c;
    if (iVar3 * 0x37 + iVar2 * -0x1d + iVar5 + 0x800 >> 0xc < 0x8000) {
      if (iVar3 * 0x37 + iVar2 * -0x1d + iVar5 + 0x800 >> 0xc < -0x8000) {
        local_98 = -0x8000;
      }
      else {
        local_98 = iVar3 * 0x37 + iVar2 * -0x1d + iVar5 + 0x800 >> 0xc;
      }
      local_94 = local_98;
    }
    else {
      local_94 = 0x7fff;
    }
    if ((int)(local_94 + (uint)local_18[1]) < 0x100) {
      if ((int)(local_94 + (uint)local_18[1]) < 0) {
        local_a0 = '\0';
      }
      else {
        local_a0 = (char)local_94 + local_18[1];
      }
      local_9c = local_a0;
    }
    else {
      local_9c = -1;
    }
    local_20[1] = local_9c;
    if ((((int)*local_10 - (int)local_10[8]) + (int)local_10[0xc]) * 0x4a + 0x800 >> 0xc < 0x8000) {
      if ((((int)*local_10 - (int)local_10[8]) + (int)local_10[0xc]) * 0x4a + 0x800 >> 0xc < -0x8000
         ) {
        local_a8 = -0x8000;
      }
      else {
        local_a8 = (((int)*local_10 - (int)local_10[8]) + (int)local_10[0xc]) * 0x4a + 0x800 >> 0xc;
      }
      local_a4 = local_a8;
    }
    else {
      local_a4 = 0x7fff;
    }
    if ((int)(local_a4 + (uint)local_18[2]) < 0x100) {
      if ((int)(local_a4 + (uint)local_18[2]) < 0) {
        local_b0 = '\0';
      }
      else {
        local_b0 = (char)local_a4 + local_18[2];
      }
      local_ac = local_b0;
    }
    else {
      local_ac = -1;
    }
    local_20[2] = local_ac;
    if (iVar1 * 0x37 + iVar3 * 0x1d + iVar4 * -0x4a + 0x800 >> 0xc < 0x8000) {
      if (iVar1 * 0x37 + iVar3 * 0x1d + iVar4 * -0x4a + 0x800 >> 0xc < -0x8000) {
        local_b8 = -0x8000;
      }
      else {
        local_b8 = iVar1 * 0x37 + iVar3 * 0x1d + iVar4 * -0x4a + 0x800 >> 0xc;
      }
      local_b4 = local_b8;
    }
    else {
      local_b4 = 0x7fff;
    }
    if ((int)(local_b4 + (uint)local_18[3]) < 0x100) {
      if ((int)(local_b4 + (uint)local_18[3]) < 0) {
        local_c0 = '\0';
      }
      else {
        local_c0 = (char)local_b4 + local_18[3];
      }
      local_bc = local_c0;
    }
    else {
      local_bc = -1;
    }
    local_20[3] = local_bc;
    local_10 = local_10 + 1;
    local_18 = local_18 + in_R9D;
    local_20 = local_20 + in_stack_00000008;
  }
  return;
}

Assistant:

void ihevc_itrans_recon_4x4_ttype1(WORD16 *pi2_src,
                                   WORD16 *pi2_tmp,
                                   UWORD8 *pu1_pred,
                                   UWORD8 *pu1_dst,
                                   WORD32 src_strd,
                                   WORD32 pred_strd,
                                   WORD32 dst_strd,
                                   WORD32 zero_cols,
                                   WORD32 zero_rows)
{
    WORD32 i, c[4];
    WORD32 add;
    WORD32 shift;
    WORD16 *pi2_tmp_orig;
    WORD32 trans_size;
    UNUSED(zero_rows);
    trans_size = TRANS_SIZE_4;

    pi2_tmp_orig = pi2_tmp;

    /* Inverse Transform 1st stage */
    shift = IT_SHIFT_STAGE_1;
    add = 1 << (shift - 1);

    for(i = 0; i < trans_size; i++)
    {
        /* Checking for Zero Cols */
        if((zero_cols & 1) == 1)
        {
            memset(pi2_tmp, 0, trans_size * sizeof(WORD16));
        }
        else
        {
            // Intermediate Variables
            c[0] = pi2_src[0] + pi2_src[2 * src_strd];
            c[1] = pi2_src[2 * src_strd] + pi2_src[3 * src_strd];
            c[2] = pi2_src[0] - pi2_src[3 * src_strd];
            c[3] = 74 * pi2_src[src_strd];

            pi2_tmp[0] =
                            CLIP_S16((29 * c[0] + 55 * c[1] + c[3] + add) >> shift);
            pi2_tmp[1] =
                            CLIP_S16((55 * c[2] - 29 * c[1] + c[3] + add) >> shift);
            pi2_tmp[2] =
                            CLIP_S16((74 * (pi2_src[0] - pi2_src[2 * src_strd] + pi2_src[3 * src_strd]) + add) >> shift);
            pi2_tmp[3] =
                            CLIP_S16((55 * c[0] + 29 * c[2] - c[3] + add) >> shift);
        }
        pi2_src++;
        pi2_tmp += trans_size;
        zero_cols = zero_cols >> 1;
    }

    pi2_tmp = pi2_tmp_orig;

    /* Inverse Transform 2nd stage */
    shift = IT_SHIFT_STAGE_2;
    add = 1 << (shift - 1);

    for(i = 0; i < trans_size; i++)
    {
        WORD32 itrans_out;
        // Intermediate Variables
        c[0] = pi2_tmp[0] + pi2_tmp[2 * trans_size];
        c[1] = pi2_tmp[2 * trans_size] + pi2_tmp[3 * trans_size];
        c[2] = pi2_tmp[0] - pi2_tmp[3 * trans_size];
        c[3] = 74 * pi2_tmp[trans_size];

        itrans_out =
                        CLIP_S16((29 * c[0] + 55 * c[1] + c[3] + add) >> shift);
        pu1_dst[0] = CLIP_U8((itrans_out + pu1_pred[0]));
        itrans_out =
                        CLIP_S16((55 * c[2] - 29 * c[1] + c[3] + add) >> shift);
        pu1_dst[1] = CLIP_U8((itrans_out + pu1_pred[1]));
        itrans_out =
                        CLIP_S16((74 * (pi2_tmp[0] - pi2_tmp[2 * trans_size] + pi2_tmp[3 * trans_size]) + add) >> shift);
        pu1_dst[2] = CLIP_U8((itrans_out + pu1_pred[2]));
        itrans_out =
                        CLIP_S16((55 * c[0] + 29 * c[2] - c[3] + add) >> shift);
        pu1_dst[3] = CLIP_U8((itrans_out + pu1_pred[3]));
        pi2_tmp++;
        pu1_pred += pred_strd;
        pu1_dst += dst_strd;
    }
}